

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep_io.c
# Opt level: O0

int LSRKStepSetDomEigSafetyFactor(void *arkode_mem,sunrealtype dom_eig_safety)

{
  double in_XMM0_Qa;
  int retval;
  ARKodeLSRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = lsrkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeLSRKStepMem *)0x1690da);
  if (local_4 == 0) {
    if (1.0 <= in_XMM0_Qa) {
      *(double *)((long)in_stack_ffffffffffffffd8 + 0x70) = in_XMM0_Qa;
    }
    else {
      *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x70) = 0x3ff028f5c28f5c29;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int LSRKStepSetDomEigSafetyFactor(void* arkode_mem, sunrealtype dom_eig_safety)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeLSRKStepMem structures */
  retval = lsrkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (dom_eig_safety < SUN_RCONST(1.0))
  {
    step_mem->dom_eig_safety = DOM_EIG_SAFETY_DEFAULT;
  }
  else { step_mem->dom_eig_safety = dom_eig_safety; }

  return ARK_SUCCESS;
}